

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O3

char * __thiscall glcts::GeometryShaderAdjacency::getVertexShaderCode(GeometryShaderAdjacency *this)

{
  return 
  "${VERSION}\n\nprecision highp float;\n\nlayout(location = 0) in vec2 position_data;\n\nvoid main()\n{\n    gl_Position = vec4(position_data, 0, 1);\n}\n"
  ;
}

Assistant:

const char* GeometryShaderAdjacency::getVertexShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"layout(location = 0) in vec2 position_data;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    gl_Position = vec4(position_data, 0, 1);\n"
								"}\n";
	return result;
}